

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
::try_emplace_impl<long>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *this,long *k)

{
  tuple<> local_21;
  tuple<long_&&> local_20;
  
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
  ::find_or_prepare_insert<long>
            (__return_storage_ptr__,
             &this->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
             ,k);
  if (__return_storage_ptr__->second == true) {
    local_20.super__Tuple_impl<0UL,_long_&&>.super__Head_base<0UL,_long_&&,_false>._M_head_impl =
         (_Tuple_impl<0UL,_long_&&>)(_Tuple_impl<0UL,_long_&&>)k;
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,long>,absl::lts_20250127::hash_internal::Hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,long>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<long&&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,long>,absl::lts_20250127::hash_internal::Hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,long>>>
                *)this,__return_storage_ptr__->first,
               (piecewise_construct_t *)&std::piecewise_construct,&local_20,&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }